

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfSetKwd(int64_t MshIdx,int KwdCod,int64_t NmbLin,...)

{
  long lVar1;
  char *pcVar2;
  byte *pbVar3;
  char in_AL;
  int iVar4;
  ulong uVar5;
  int64_t iVar6;
  uint uVar7;
  undefined8 in_RCX;
  long lVar8;
  ulong uVar9;
  long in_R8;
  undefined8 in_R9;
  uint *puVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 in_stack_00000008;
  va_list VarArg;
  int KwdCod_local;
  int local_f8;
  undefined4 local_f4;
  char **local_f0;
  undefined8 local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar7 = 0;
  KwdCod_local = KwdCod;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  RecBlk((GmfMshSct *)MshIdx,*(void **)(MshIdx + 0x300428),0);
  if (0xffffff0f < KwdCod - 0xf1U) {
    uVar9 = (ulong)(uint)KwdCod;
    lVar1 = MshIdx + uVar9 * 0x3300;
    puVar10 = (uint *)(lVar1 + 0x110);
    local_f0 = GmfKwdFmt[uVar9] + 2;
    pcVar2 = *local_f0;
    if ((((*pcVar2 == 'h') || (*pcVar2 == 's')) && (pcVar2[1] == 'r')) && (pcVar2[2] == '\0')) {
      *(int *)(lVar1 + 0x124) = (int)local_d0;
      for (lVar8 = 0; lVar8 < (int)local_d0; lVar8 = lVar8 + 1) {
        *(undefined4 *)(lVar1 + 0x128 + lVar8 * 4) = *(undefined4 *)(local_c8 + lVar8 * 4);
      }
      local_f4 = (undefined4)lVar8;
      pbVar3 = (byte *)*local_f0;
      uVar7 = *pbVar3 - 0x68;
      if ((uVar7 == 0) && (uVar7 = pbVar3[1] - 0x72, uVar7 == 0)) {
        uVar7 = (uint)pbVar3[2];
      }
      if (uVar7 == 0) {
        *(undefined4 *)(lVar1 + 0x114) = (undefined4)local_c0;
        *(undefined4 *)(lVar1 + 0x118) = in_stack_00000008;
      }
    }
    ExpFmt((GmfMshSct *)MshIdx,KwdCod);
    uVar7 = *puVar10;
    if ((ulong)uVar7 != 0) {
      uVar5 = (ulong)uVar7;
      if (uVar7 != 1) {
        uVar5 = NmbLin;
      }
      *(ulong *)(lVar1 + 0x10d8) = uVar5;
      uVar7 = *(uint *)(MshIdx + 0xc);
      if (((uVar7 & 2) != 0) && (*(long *)(MshIdx + 0x30) != 0)) {
        iVar6 = GetFilPos((GmfMshSct *)MshIdx);
        iVar4 = SetFilPos((GmfMshSct *)MshIdx,*(int64_t *)(MshIdx + 0x30));
        if (iVar4 == 0) {
          return 0;
        }
        SetPos((GmfMshSct *)MshIdx,iVar6);
        iVar4 = SetFilPos((GmfMshSct *)MshIdx,iVar6);
        if (iVar4 == 0) {
          return 0;
        }
        uVar7 = *(uint *)(MshIdx + 0xc);
      }
      if ((uVar7 & 1) == 0) {
        RecWrd((GmfMshSct *)MshIdx,&KwdCod_local);
        iVar6 = GetFilPos((GmfMshSct *)MshIdx);
        *(int64_t *)(MshIdx + 0x30) = iVar6;
        SetPos((GmfMshSct *)MshIdx,0);
        if (*puVar10 != 1) {
          if (*(int *)(MshIdx + 4) < 4) {
            local_f4 = *(undefined4 *)(lVar1 + 0x10d8);
            RecWrd((GmfMshSct *)MshIdx,&local_f4);
          }
          else {
            RecDblWrd((GmfMshSct *)MshIdx,(undefined4 *)(lVar1 + 0x10d8));
          }
          if (*puVar10 == 3) {
            RecWrd((GmfMshSct *)MshIdx,(int *)(lVar1 + 0x124));
            for (lVar8 = 0; lVar8 < *(int *)(lVar1 + 0x124); lVar8 = lVar8 + 1) {
              local_f8 = *(int *)(lVar1 + 0x128 + lVar8 * 4);
              if (4 < local_f8) {
                local_f8 = 1;
              }
              RecWrd((GmfMshSct *)MshIdx,&local_f8);
            }
            pbVar3 = (byte *)GmfKwdFmt[KwdCod_local][2];
            uVar7 = *pbVar3 - 0x68;
            if ((uVar7 == 0) && (uVar7 = pbVar3[1] - 0x72, uVar7 == 0)) {
              uVar7 = (uint)pbVar3[2];
            }
            if (uVar7 == 0) {
              RecWrd((GmfMshSct *)MshIdx,(void *)(lVar1 + 0x114));
              RecWrd((GmfMshSct *)MshIdx,(void *)(lVar1 + 0x118));
            }
          }
        }
      }
      else {
        fprintf(*(FILE **)(MshIdx + 0x300410),"\n%s\n",GmfKwdFmt[uVar9][0]);
        if ((*puVar10 != 1) &&
           (fprintf(*(FILE **)(MshIdx + 0x300410),"%ld\n",*(undefined8 *)(lVar1 + 0x10d8)),
           *puVar10 == 3)) {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)*(uint *)(lVar1 + 0x124));
          for (lVar8 = 0; lVar8 < *(int *)(lVar1 + 0x124); lVar8 = lVar8 + 1) {
            uVar7 = *(uint *)(lVar1 + 0x128 + lVar8 * 4);
            uVar9 = (ulong)uVar7;
            if (4 < (int)uVar7) {
              uVar9 = 1;
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",uVar9);
          }
          fputc(10,*(FILE **)(MshIdx + 0x300410));
        }
        pbVar3 = (byte *)*local_f0;
        uVar7 = *pbVar3 - 0x68;
        if ((uVar7 == 0) && (uVar7 = pbVar3[1] - 0x72, uVar7 == 0)) {
          uVar7 = (uint)pbVar3[2];
        }
        if (uVar7 == 0) {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%d %d\n",(ulong)*(uint *)(lVar1 + 0x114),
                  (ulong)*(uint *)(lVar1 + 0x118));
        }
      }
      uVar7 = 1;
      *(undefined8 *)(MshIdx + 0x40) = 0;
      *(long *)(MshIdx + 0x38) =
           *(long *)(MshIdx + 0x38) + (long)*(int *)(lVar1 + 0x120) * *(long *)(lVar1 + 0x10d8) * 4;
    }
  }
  return uVar7;
}

Assistant:

int GmfSetKwd(int64_t MshIdx, int KwdCod, int64_t NmbLin, ...)
{
   int         i, typ, *TypTab;
   int64_t     CurPos;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   RecBlk(msh, msh->buf, 0);

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Read further arguments if this kw is a solution
   if(!strcmp(GmfKwdFmt[ KwdCod ][2], "sr")
   || !strcmp(GmfKwdFmt[ KwdCod ][2], "hr"))
   {
      va_start(VarArg, NmbLin);

      kwd->NmbTyp = va_arg(VarArg, int);
      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         kwd->TypTab[i] = TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
      {
         kwd->deg = va_arg(VarArg, int);
         kwd->NmbNod = va_arg(VarArg, int);
      }

      va_end(VarArg);
   }

   // Setup the kwd info
   ExpFmt(msh, KwdCod);

   if(!kwd->typ)
      return(0);
   else if(kwd->typ == InfKwd)
      kwd->NmbLin = 1;
   else
      kwd->NmbLin = NmbLin;

   // Store the next kwd position in binary file
   if( (msh->typ & Bin) && msh->NexKwdPos )
   {
      CurPos = GetFilPos(msh);

      if(!SetFilPos(msh, msh->NexKwdPos))
         return(0);

      SetPos(msh, CurPos);

      if(!SetFilPos(msh, CurPos))
         return(0);
   }

   // Write the header
   if(msh->typ & Asc)
   {
      fprintf(msh->hdl, "\n%s\n", GmfKwdFmt[ KwdCod ][0]);

      if(kwd->typ != InfKwd)
         fprintf(msh->hdl, INT64_T_FMT"\n", kwd->NmbLin);

      // In case of solution field, write the extended header
      if(kwd->typ == SolKwd)
      {
         fprintf(msh->hdl, "%d ", kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            fprintf(msh->hdl, "%d ", typ);
         }

         fprintf(msh->hdl, "\n");
      }

      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         fprintf(msh->hdl, "%d %d\n", kwd->deg, kwd->NmbNod);
   }
   else
   {
      RecWrd(msh, (unsigned char *)&KwdCod);
      msh->NexKwdPos = GetFilPos(msh);
      SetPos(msh, 0);

      if(kwd->typ != InfKwd)
      {
         if(msh->ver < 4)
         {
            i = (int)kwd->NmbLin;
            RecWrd(msh, (unsigned char *)&i);
         }
         else
            RecDblWrd(msh, (unsigned char *)&kwd->NmbLin);
      }

      // In case of solution field, write the extended header at once
      if(kwd->typ == SolKwd)
      {
         RecWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            RecWrd(msh, (unsigned char *)&typ);
         }

         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            RecWrd(msh, (unsigned char *)&kwd->deg);
            RecWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
      }
   }

   // Reset write buffer position
   msh->pos = 0;

   // Compute the total file size and check if it crosses the 2GB threshold
   msh->siz += kwd->NmbLin * kwd->NmbWrd * WrdSiz;

   return(1);
}